

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O0

bool __thiscall QJsonPrivate::Parser::parseMember(Parser *this)

{
  bool bVar1;
  char cVar2;
  Parser *in_RDI;
  Parser *in_stack_00000010;
  char token;
  Parser *in_stack_00000038;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  bool local_1;
  
  bVar1 = parseString(in_stack_00000038);
  if (bVar1) {
    cVar2 = nextToken((Parser *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    if (cVar2 == ':') {
      bVar1 = eatSpace(in_RDI);
      if (bVar1) {
        local_1 = parseValueIntoContainer(in_stack_00000010);
      }
      else {
        in_RDI->lastError = UnterminatedObject;
        local_1 = false;
      }
    }
    else {
      in_RDI->lastError = MissingNameSeparator;
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Parser::parseMember()
{
    if (!parseString())
        return false;
    char token = nextToken();
    if (token != NameSeparator) {
        lastError = QJsonParseError::MissingNameSeparator;
        return false;
    }
    if (!eatSpace()) {
        lastError = QJsonParseError::UnterminatedObject;
        return false;
    }

    return parseValueIntoContainer();
}